

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O0

bool __thiscall xray_re::xr_file_system::parse_fs_spec(xr_file_system *this,xr_reader *r)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  path_alias *ppVar4;
  string *local_170;
  string *local_110;
  path_alias *pa;
  int i;
  char *last;
  int c;
  uint line;
  string values [4];
  undefined1 local_50 [8];
  string alias;
  char *end;
  char *p;
  xr_reader *r_local;
  xr_file_system *this_local;
  
  p = (char *)r;
  r_local = (xr_reader *)this;
  pcVar2 = xr_reader::pointer<char_const>(r);
  end = pcVar2;
  sVar3 = xr_reader::size((xr_reader *)p);
  alias.field_2._8_8_ = pcVar2 + sVar3;
  std::__cxx11::string::string((string *)local_50);
  local_110 = (string *)&c;
  do {
    std::__cxx11::string::string(local_110);
    local_110 = local_110 + 0x20;
  } while (local_110 != (string *)((long)&values[3].field_2 + 8));
  last._4_4_ = 1;
  do {
    if ((ulong)alias.field_2._8_8_ <= end) {
      this_local._7_1_ = 1;
LAB_001ba277:
      local_170 = (string *)(values[3].field_2._M_local_buf + 8);
      do {
        local_170 = local_170 + -0x20;
        std::__cxx11::string::~string(local_170);
      } while (local_170 != (string *)&c);
      std::__cxx11::string::~string((string *)local_50);
      return (bool)(this_local._7_1_ & 1);
    }
    iVar1 = (int)*end;
    if (iVar1 == 0x24) {
      pcVar2 = read_alias(end,(char *)alias.field_2._8_8_);
      if (pcVar2 == (char *)0x0) {
        msg("can\'t parse line %u",(ulong)last._4_4_);
        this_local._7_1_ = 0;
        goto LAB_001ba277;
      }
      std::__cxx11::string::assign<char_const*,void>((string *)local_50,end,pcVar2);
      pcVar2 = skip_ws(pcVar2,(char *)alias.field_2._8_8_);
      end = pcVar2;
      if ((pcVar2 == (char *)alias.field_2._8_8_) || (end = pcVar2 + 1, *pcVar2 != '=')) {
        msg("can\'t parse line %u",(ulong)last._4_4_);
        this_local._7_1_ = 0;
        goto LAB_001ba277;
      }
      pa._4_4_ = -2;
      while (pa._4_4_ < 4) {
        pcVar2 = read_value(&end,(char *)alias.field_2._8_8_);
        if ((pa._4_4_ < 0) && ((pcVar2 == (char *)alias.field_2._8_8_ || (*pcVar2 != '|')))) {
          msg("can\'t parse line %u",(ulong)last._4_4_);
          this_local._7_1_ = 0;
          goto LAB_001ba277;
        }
        if (-1 < pa._4_4_) {
          std::__cxx11::string::assign<char_const*,void>
                    ((string *)(&c + (long)pa._4_4_ * 8),end,pcVar2);
        }
        end = pcVar2 + 1;
        pa._4_4_ = pa._4_4_ + 1;
        if ((end == (char *)alias.field_2._8_8_) || (*pcVar2 != '|')) break;
      }
      if (pa._4_4_ < 1) {
        __assert_fail("i > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_file_system.cxx"
                      ,0xa8,"bool xray_re::xr_file_system::parse_fs_spec(xr_reader &)");
      }
      if (pa._4_4_ < 2) {
        std::__cxx11::string::clear();
      }
      ppVar4 = add_path_alias(this,(string *)local_50,(string *)&c,
                              (string *)((long)&values[0].field_2 + 8));
      if (ppVar4 == (path_alias *)0x0) {
        msg("can\'t parse line %u",(ulong)last._4_4_);
        this_local._7_1_ = 0;
        goto LAB_001ba277;
      }
      if (2 < pa._4_4_) {
        std::__cxx11::string::operator=
                  ((string *)&ppVar4->filter,(string *)(values[1].field_2._M_local_buf + 8));
      }
      if (3 < pa._4_4_) {
        std::__cxx11::string::operator=
                  ((string *)&ppVar4->caption,(string *)(values[2].field_2._M_local_buf + 8));
      }
    }
    else if ((iVar1 != 0x3b) && (iVar1 = isspace(iVar1), iVar1 == 0)) {
      msg("can\'t parse line %u",(ulong)last._4_4_);
      this_local._7_1_ = 0;
      goto LAB_001ba277;
    }
    end = next_line(end,(char *)alias.field_2._8_8_);
    last._4_4_ = last._4_4_ + 1;
  } while( true );
}

Assistant:

bool xr_file_system::parse_fs_spec(xr_reader& r)
{
	const char* p = r.pointer<const char>();
	const char* end = p + r.size();
	std::string alias, values[4];
	for (unsigned line = 1; p < end; p = next_line(p, end), ++line) {
		int c = *p;
		if (c == '$') {
			const char* last = read_alias(p, end);
			if (last == 0) {
				msg("can't parse line %u", line);
				return false;
			}
			alias.assign(p, last);

			p = skip_ws(last, end);
			if (p == end || *p++ != '=') {
				msg("can't parse line %u", line);
				return false;
			}

			int i;
			for (i = -2; i < 4;) {
				last = read_value(p, end);
				if (i < 0 && (last == end || *last != '|')) {
					msg("can't parse line %u", line);
					return false;
				}
				if (i >= 0)
					values[i].assign(p, last);
				p = last + 1;
				++i;
				if (p == end || *last != '|')
					break;
			}
			assert(i > 0);
			if (i < 2)
				values[1].clear();
			path_alias* pa = add_path_alias(alias, values[0], values[1]);
			if (pa == 0) {
				msg("can't parse line %u", line);
				return false;
			}
			if (i > 2)
				pa->filter = values[2];
			if (i > 3)
				pa->caption = values[3];
		} else if (c != ';' && !std::isspace(c)) {
			msg("can't parse line %u", line);
			return false;
		}
	}
	return true;
}